

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_serialize_struct
          (t_netstd_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  ostream *poVar1;
  string local_48;
  string *local_28;
  string *prefix_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_28 = prefix;
  prefix_local = (string *)tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar1 = std::operator<<(out,(string *)&local_48);
  poVar1 = std::operator<<(poVar1,"await ");
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,".WriteAsync(oprot, ");
  poVar1 = std::operator<<(poVar1,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,");");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void t_netstd_generator::generate_serialize_struct(ostream& out, t_struct* tstruct, string prefix)
{
    (void)tstruct;
    out << indent() << "await " << prefix << ".WriteAsync(oprot, " << CANCELLATION_TOKEN_NAME << ");" << endl;
}